

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedMessageFieldGenerator::GenerateAccessorDeclarations
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  RepeatedMessageFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "inline const $type$& $name$(int index) const$deprecation$;\ninline $type$* mutable_$name$(int index)$deprecation$;\ninline $type$* add_$name$()$deprecation$;\n"
                    );
  io::Printer::Print(printer,&this->variables_,
                     "inline const ::google::protobuf::RepeatedPtrField< $type$ >&\n    $name$() const$deprecation$;\ninline ::google::protobuf::RepeatedPtrField< $type$ >*\n    mutable_$name$()$deprecation$;\n"
                    );
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::
GenerateAccessorDeclarations(io::Printer* printer) const {
  printer->Print(variables_,
    "inline const $type$& $name$(int index) const$deprecation$;\n"
    "inline $type$* mutable_$name$(int index)$deprecation$;\n"
    "inline $type$* add_$name$()$deprecation$;\n");
  printer->Print(variables_,
    "inline const ::google::protobuf::RepeatedPtrField< $type$ >&\n"
    "    $name$() const$deprecation$;\n"
    "inline ::google::protobuf::RepeatedPtrField< $type$ >*\n"
    "    mutable_$name$()$deprecation$;\n");
}